

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

SUNErrCode SUNLinSol_SPGMRSetGSType(SUNLinearSolver S,int gstype)

{
  SUNContext_conflict sunctx_local_scope_;
  int gstype_local;
  SUNLinearSolver S_local;
  
  *(int *)((long)S->content + 8) = gstype;
  return 0;
}

Assistant:

SUNErrCode SUNLinSol_SPGMRSetGSType(SUNLinearSolver S, int gstype)
{
  SUNFunctionBegin(S->sunctx);
  /* Check for legal gstype */
  SUNAssert(gstype == SUN_MODIFIED_GS || gstype == SUN_CLASSICAL_GS,
            SUN_ERR_ARG_OUTOFRANGE);

  /* Set pretype */
  SPGMR_CONTENT(S)->gstype = gstype;
  return SUN_SUCCESS;
}